

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeConditional(Ref condition,Ref ifTrue,Ref ifFalse)

{
  Value *pVVar1;
  Ref r;
  Ref local_30;
  Ref local_28;
  Ref ifFalse_local;
  Ref ifTrue_local;
  Ref condition_local;
  
  local_28.inst = ifFalse.inst;
  ifFalse_local = ifTrue;
  local_30 = makeRawArray(4);
  pVVar1 = Ref::operator->(&local_30);
  r = makeRawString((IString *)&CONDITIONAL);
  pVVar1 = Value::push_back(pVVar1,r);
  pVVar1 = Value::push_back(pVVar1,condition);
  pVVar1 = Value::push_back(pVVar1,ifFalse_local);
  pVVar1 = Value::push_back(pVVar1,local_28);
  Ref::Ref(&condition_local,pVVar1);
  return (Ref)condition_local.inst;
}

Assistant:

static Ref makeConditional(Ref condition, Ref ifTrue, Ref ifFalse) {
    return &makeRawArray(4)
              ->push_back(makeRawString(CONDITIONAL))
              .push_back(condition)
              .push_back(ifTrue)
              .push_back(ifFalse);
  }